

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

BucketWidthType duckdb::TimeBucket::ClassifyBucketWidthErrorThrow(interval_t bucket_width)

{
  BucketWidthType BVar1;
  NotImplementedException *pNVar2;
  long lVar3;
  long in_RSI;
  ulong in_RDI;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  interval_t local_30;
  
  if ((int)in_RDI == 0) {
    lVar3 = duckdb::Interval::GetMicro(&local_30);
    if (lVar3 < 1) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Period must be greater than 0","");
      duckdb::NotImplementedException::NotImplementedException(pNVar2,(string *)local_50);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
    BVar1 = CONVERTIBLE_TO_MICROS;
  }
  else {
    if ((in_RDI >> 0x20 != 0) || (in_RSI != 0)) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Month intervals cannot have day or time component","");
      duckdb::NotImplementedException::NotImplementedException(pNVar2,(string *)local_50);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
    BVar1 = CONVERTIBLE_TO_MONTHS;
    if ((int)in_RDI < 0) {
      pNVar2 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Period must be greater than 0","");
      duckdb::NotImplementedException::NotImplementedException(pNVar2,(string *)local_50);
      __cxa_throw(pNVar2,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return BVar1;
}

Assistant:

static inline BucketWidthType ClassifyBucketWidthErrorThrow(const interval_t bucket_width) {
		if (bucket_width.months == 0) {
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			if (bucket_width_micros <= 0) {
				throw NotImplementedException("Period must be greater than 0");
			}
			return BucketWidthType::CONVERTIBLE_TO_MICROS;
		} else if (bucket_width.months != 0 && bucket_width.days == 0 && bucket_width.micros == 0) {
			if (bucket_width.months < 0) {
				throw NotImplementedException("Period must be greater than 0");
			}
			return BucketWidthType::CONVERTIBLE_TO_MONTHS;
		} else {
			throw NotImplementedException("Month intervals cannot have day or time component");
		}
	}